

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86_fma::forward_inplace(Dropout_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  float fVar17;
  float fVar19;
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  
  if (*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_fma[-3]) != 1.0) {
    iVar8 = bottom_top_blob->dims;
    auVar18 = ZEXT416((uint)*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_fma[-3]));
    if (bottom_top_blob->elempack == 4) {
      uVar10 = bottom_top_blob->w;
      uVar14 = bottom_top_blob->h;
      auVar18 = vshufps_avx(auVar18,auVar18,0);
      fVar17 = auVar18._0_4_;
      fVar19 = auVar18._4_4_;
      fVar20 = auVar18._8_4_;
      fVar21 = auVar18._12_4_;
      if (iVar8 == 3) {
        uVar11 = 0;
        iVar8 = uVar14 * uVar10;
        if ((int)(uVar14 * uVar10) < 1) {
          iVar8 = 0;
        }
        uVar12 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar12 = 0;
        }
        for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
          pfVar13 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar15 = iVar8;
          while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
            *pfVar13 = fVar17 * *pfVar13;
            pfVar13[1] = fVar19 * pfVar13[1];
            pfVar13[2] = fVar20 * pfVar13[2];
            pfVar13[3] = fVar21 * pfVar13[3];
            pfVar13 = pfVar13 + 4;
          }
        }
      }
      else if (iVar8 == 2) {
        uVar11 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        uVar12 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar12 = uVar11;
        }
        for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
          pfVar13 = (float *)((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar14 = uVar10;
          while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
            *pfVar13 = fVar17 * *pfVar13;
            pfVar13[1] = fVar19 * pfVar13[1];
            pfVar13[2] = fVar20 * pfVar13[2];
            pfVar13[3] = fVar21 * pfVar13[3];
            pfVar13 = pfVar13 + 4;
          }
        }
      }
      else if (iVar8 == 1) {
        lVar9 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (; (ulong)uVar10 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
          pfVar13 = (float *)((long)bottom_top_blob->data + lVar9);
          fVar2 = pfVar13[1];
          fVar3 = pfVar13[2];
          fVar4 = pfVar13[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar9);
          *pfVar1 = fVar17 * *pfVar13;
          pfVar1[1] = fVar19 * fVar2;
          pfVar1[2] = fVar20 * fVar3;
          pfVar1[3] = fVar21 * fVar4;
        }
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        iVar8 = Dropout::forward_inplace
                          ((Dropout *)
                           ((long)&this->_vptr_Dropout_x86_fma +
                           (long)this->_vptr_Dropout_x86_fma[-3]),bottom_top_blob,opt);
        return iVar8;
      }
      uVar10 = bottom_top_blob->w;
      uVar14 = bottom_top_blob->h;
      auVar18 = vshufps_avx(auVar18,auVar18,0);
      fVar17 = auVar18._0_4_;
      fVar19 = auVar18._4_4_;
      fVar20 = auVar18._8_4_;
      fVar21 = auVar18._12_4_;
      if (iVar8 == 3) {
        uVar11 = 0;
        iVar8 = uVar14 * uVar10;
        if ((int)(uVar14 * uVar10) < 1) {
          iVar8 = 0;
        }
        uVar12 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar12 = 0;
        }
        for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
          pfVar13 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar15 = iVar8;
          while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
            *pfVar13 = fVar17 * *pfVar13;
            pfVar13[1] = fVar19 * pfVar13[1];
            pfVar13[2] = fVar20 * pfVar13[2];
            pfVar13[3] = fVar21 * pfVar13[3];
            pfVar13[4] = fVar17 * pfVar13[4];
            pfVar13[5] = fVar19 * pfVar13[5];
            pfVar13[6] = fVar20 * pfVar13[6];
            pfVar13[7] = 0.0;
            pfVar13 = pfVar13 + 8;
          }
        }
      }
      else if (iVar8 == 2) {
        uVar11 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        uVar12 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar12 = uVar11;
        }
        for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
          pfVar13 = (float *)((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar14 = uVar10;
          while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
            *pfVar13 = fVar17 * *pfVar13;
            pfVar13[1] = fVar19 * pfVar13[1];
            pfVar13[2] = fVar20 * pfVar13[2];
            pfVar13[3] = fVar21 * pfVar13[3];
            pfVar13[4] = fVar17 * pfVar13[4];
            pfVar13[5] = fVar19 * pfVar13[5];
            pfVar13[6] = fVar20 * pfVar13[6];
            pfVar13[7] = 0.0;
            pfVar13 = pfVar13 + 8;
          }
        }
      }
      else if (iVar8 == 1) {
        lVar9 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (; (ulong)uVar10 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
          pfVar13 = (float *)((long)bottom_top_blob->data + lVar9);
          fVar2 = pfVar13[1];
          fVar3 = pfVar13[2];
          fVar4 = pfVar13[3];
          fVar5 = pfVar13[4];
          fVar6 = pfVar13[5];
          fVar7 = pfVar13[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar9);
          *pfVar1 = fVar17 * *pfVar13;
          pfVar1[1] = fVar19 * fVar2;
          pfVar1[2] = fVar20 * fVar3;
          pfVar1[3] = fVar21 * fVar4;
          pfVar1[4] = fVar17 * fVar5;
          pfVar1[5] = fVar19 * fVar6;
          pfVar1[6] = fVar20 * fVar7;
          pfVar1[7] = 0.0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}